

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O3

Var Js::JavascriptMath::Add_Full(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  Var pvVar6;
  JavascriptString *pJVar7;
  JavascriptString *pstRight;
  int64 iVar8;
  int64 iVar9;
  ulong uVar10;
  uint64 uVar11;
  uint64 uVar12;
  Type TVar13;
  double dVar14;
  double dVar15;
  Type TVar16;
  
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x105,"(aLeft != nullptr)","aLeft != nullptr");
    if (!bVar2) goto LAB_00a9c4cd;
    *puVar4 = 0;
  }
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x106,"(aRight != nullptr)","aRight != nullptr");
    if (!bVar2) goto LAB_00a9c4cd;
    *puVar4 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x107,"(scriptContext != nullptr)","scriptContext != nullptr");
    if (!bVar2) goto LAB_00a9c4cd;
    *puVar4 = 0;
  }
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00a9c4cd;
    *puVar4 = 0;
LAB_00a9be52:
    pRVar5 = UnsafeVarTo<Js::RecyclableObject>(aLeft);
    if (pRVar5 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00a9c4cd;
      *puVar4 = 0;
    }
    TVar13 = ((pRVar5->type).ptr)->typeId;
    if (0x57 < (int)TVar13) {
      BVar3 = RecyclableObject::IsExternal(pRVar5);
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) goto LAB_00a9c4cd;
        goto LAB_00a9bf29;
      }
    }
  }
  else if (((ulong)aLeft & 0x1ffff00000000) == 0x1000000000000 ||
           ((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) {
    TVar13 = TypeIds_FirstNumberType;
    if ((((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) &&
       (TVar13 = TypeIds_Number, (ulong)aLeft >> 0x32 == 0)) goto LAB_00a9be52;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00a9c4cd;
    TVar13 = TypeIds_FirstNumberType;
LAB_00a9bf29:
    *puVar4 = 0;
  }
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00a9c4cd;
    *puVar4 = 0;
LAB_00a9c038:
    pRVar5 = UnsafeVarTo<Js::RecyclableObject>(aRight);
    if (pRVar5 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00a9c4cd;
      *puVar4 = 0;
    }
    TVar16 = ((pRVar5->type).ptr)->typeId;
    if (0x57 < (int)TVar16) {
      BVar3 = RecyclableObject::IsExternal(pRVar5);
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) goto LAB_00a9c4cd;
        goto LAB_00a9c114;
      }
    }
  }
  else if (((ulong)aRight & 0x1ffff00000000) == 0x1000000000000 ||
           ((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
    TVar16 = TypeIds_FirstNumberType;
    if ((((ulong)aRight & 0xffff000000000000) != 0x1000000000000) &&
       (TVar16 = TypeIds_Number, (ulong)aRight >> 0x32 == 0)) goto LAB_00a9c038;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00a9c4cd;
    TVar16 = TypeIds_FirstNumberType;
LAB_00a9c114:
    *puVar4 = 0;
  }
  if (TVar16 == TVar13) {
    if (TVar13 == TypeIds_FirstNumberType) {
      iVar8 = TaggedInt::ToInt64(aLeft);
      iVar9 = TaggedInt::ToInt64(aRight);
      uVar10 = iVar9 + iVar8;
      if ((long)(int)uVar10 == uVar10) {
        pvVar6 = (Var)(uVar10 & 0xffffffff | 0x1000000000000);
      }
      else {
        dVar14 = (double)(long)uVar10;
        uVar11 = NumberUtilities::ToSpecial(dVar14);
        bVar2 = NumberUtilities::IsNan(dVar14);
        if (bVar2) {
          uVar12 = NumberUtilities::ToSpecial(dVar14);
          if (uVar12 != 0xfff8000000000000) {
            uVar12 = NumberUtilities::ToSpecial(dVar14);
            if (uVar12 != 0x7ff8000000000000) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar4 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                          ,0xa2,
                                          "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                          ,"We should only produce a NaN with this value");
              if (!bVar2) goto LAB_00a9c4cd;
              *puVar4 = 0;
            }
          }
        }
        pvVar6 = (Var)(uVar11 ^ 0xfffc000000000000);
      }
      return pvVar6;
    }
    if (TVar13 == TypeIds_String) {
      pJVar7 = UnsafeVarTo<Js::JavascriptString>(aLeft);
      pstRight = UnsafeVarTo<Js::JavascriptString>(aRight);
      pJVar7 = JavascriptString::Concat(pJVar7,pstRight);
      return pJVar7;
    }
    if (TVar13 != TypeIds_Number) {
LAB_00a9c381:
      pvVar6 = Add_FullHelper_Wrapper(aLeft,aRight,scriptContext,(JavascriptNumber *)0x0,false);
      return pvVar6;
    }
    if ((ulong)aLeft >> 0x32 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                  ,0xd4,"(Is(aValue))",
                                  "Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar2) goto LAB_00a9c4cd;
      *puVar4 = 0;
    }
    if (aRight < (Var)0x4000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                  ,0xd4,"(Is(aValue))",
                                  "Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar2) goto LAB_00a9c4cd;
      *puVar4 = 0;
    }
    dVar14 = (double)((ulong)aLeft ^ 0xfffc000000000000);
  }
  else {
    if ((TVar13 == TypeIds_Number) && (TVar16 == TypeIds_FirstNumberType)) {
      if ((ulong)aLeft >> 0x32 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                    ,0xd4,"(Is(aValue))",
                                    "Ensure var is actually a \'JavascriptNumber\'");
        if (!bVar2) {
LAB_00a9c4cd:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      dVar14 = (double)((ulong)aLeft ^ 0xfffc000000000000);
      dVar15 = (double)(int)aRight;
      goto LAB_00a9c367;
    }
    if ((TVar13 != TypeIds_FirstNumberType) || (TVar16 != TypeIds_Number)) goto LAB_00a9c381;
    if ((ulong)aRight >> 0x32 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                  ,0xd4,"(Is(aValue))",
                                  "Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar2) goto LAB_00a9c4cd;
      *puVar4 = 0;
    }
    dVar14 = (double)(int)aLeft;
  }
  dVar15 = (double)((ulong)aRight ^ 0xfffc000000000000);
LAB_00a9c367:
  pvVar6 = JavascriptNumber::ToVarNoCheck(dVar15 + dVar14,scriptContext);
  return pvVar6;
}

Assistant:

Var JavascriptMath::Add_Full(Var aLeft, Var aRight, ScriptContext* scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_Add_Full);
            Assert(aLeft != nullptr);
            Assert(aRight != nullptr);
            Assert(scriptContext != nullptr);

            Js::TypeId typeLeft = JavascriptOperators::GetTypeId(aLeft);
            Js::TypeId typeRight = JavascriptOperators::GetTypeId(aRight);

            if (typeRight == typeLeft)
            {
                // If both sides are numbers/string, then we can do the addition directly
                if(typeLeft == TypeIds_Number)
                {
                    double sum = JavascriptNumber::GetValue(aLeft) + JavascriptNumber::GetValue(aRight);
                    return JavascriptNumber::ToVarNoCheck(sum, scriptContext);
                }
                else if (typeLeft == TypeIds_Integer)
                {
                    __int64 sum = TaggedInt::ToInt64(aLeft) + TaggedInt::ToInt64(aRight);
                    return JavascriptNumber::ToVar(sum, scriptContext);
                }
                else if (typeLeft == TypeIds_String)
                {
                    return JavascriptString::Concat(UnsafeVarTo<JavascriptString>(aLeft), UnsafeVarTo<JavascriptString>(aRight));
                }
            }
            else if(typeLeft == TypeIds_Number && typeRight == TypeIds_Integer)
            {
                double sum = JavascriptNumber::GetValue(aLeft) + TaggedInt::ToDouble(aRight);
                return JavascriptNumber::ToVarNoCheck(sum, scriptContext);
            }
            else if(typeLeft == TypeIds_Integer && typeRight == TypeIds_Number)
            {
                double sum = TaggedInt::ToDouble(aLeft) + JavascriptNumber::GetValue(aRight);
                return JavascriptNumber::ToVarNoCheck(sum, scriptContext);
            }

            return Add_FullHelper_Wrapper(aLeft, aRight, scriptContext, nullptr, false);
            JIT_HELPER_END(Op_Add_Full);
         }